

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O2

void __thiscall Unowned_Throw_Test::Unowned_Throw_Test(Unowned_Throw_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0018d150;
  return;
}

Assistant:

TEST(Unowned, Throw)
{
    unowned_ptr<int> pNone {};
    EXPECT_ANY_THROW(++*pNone);

    struct Foo
    {
        int bar;
    };

    Foo foo;
    foo.bar = 0;
    unowned_ptr<Foo> pFoo { &foo };
    ++pFoo->bar;
    EXPECT_EQ(foo.bar, 1);
    pFoo = {};
    EXPECT_ANY_THROW(++pFoo->bar);
}